

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O0

void __thiscall
flatbuffers::FlatBufferBuilder::AddElement<short>
          (FlatBufferBuilder *this,voffset_t field,short e,short def)

{
  uoffset_t off_00;
  uoffset_t off;
  short def_local;
  short e_local;
  voffset_t field_local;
  FlatBufferBuilder *this_local;
  
  if ((e != def) || ((this->force_defaults_ & 1U) != 0)) {
    off_00 = PushElement<short>(this,e);
    TrackField(this,field,off_00);
  }
  return;
}

Assistant:

void AddElement(voffset_t field, T e, T def) {
    // We don't serialize values equal to the default.
    if (e == def && !force_defaults_) return;
    auto off = PushElement(e);
    TrackField(field, off);
  }